

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

flatcc_builder_ref_t flatcc_builder_end_string(flatcc_builder_t *B)

{
  uint uVar1;
  __flatcc_builder_frame_t *p_Var2;
  flatcc_builder_ref_t fVar3;
  uint uVar4;
  
  if (B->frame->type != 6) {
    __assert_fail("(B->frame[0].type) == flatcc_builder_string",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                  ,0x6e9,"flatcc_builder_ref_t flatcc_builder_end_string(flatcc_builder_t *)");
  }
  uVar4 = (B->frame->container).table.pl_end;
  if (uVar4 == B->ds_offset) {
    fVar3 = flatcc_builder_create_string(B,(char *)B->ds,(ulong)uVar4);
    if (fVar3 != 0) {
      memset(B->ds,0,(ulong)B->ds_offset);
      p_Var2 = B->frame;
      B->ds_offset = p_Var2->ds_offset;
      uVar4 = p_Var2->ds_first;
      B->ds_first = uVar4;
      uVar1 = p_Var2->type_limit;
      B->ds = (uint8_t *)((ulong)uVar4 + (long)B->buffers[1].iov_base);
      uVar4 = (int)B->buffers[1].iov_len - uVar4;
      if (uVar1 <= uVar4) {
        uVar4 = uVar1;
      }
      B->ds_limit = uVar4;
      if (B->min_align < B->align) {
        B->min_align = B->align;
      }
      B->align = p_Var2->align;
      B->frame = p_Var2 + -1;
      B->level = B->level + -1;
    }
    return fVar3;
  }
  __assert_fail("frame(container.vector.count) == B->ds_offset",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                ,0x6ea,"flatcc_builder_ref_t flatcc_builder_end_string(flatcc_builder_t *)");
}

Assistant:

flatcc_builder_ref_t flatcc_builder_end_string(flatcc_builder_t *B)
{
    flatcc_builder_ref_t string_ref;

    check(frame(type) == flatcc_builder_string, "expected string frame");
    FLATCC_ASSERT(frame(container.vector.count) == B->ds_offset);
    if (0 == (string_ref = flatcc_builder_create_string(B,
            (const char *)B->ds, B->ds_offset))) {
        return 0;
    }
    exit_frame(B);
    return string_ref;
}